

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::CheckFuncVar(Validator *this,Var *var,Func **out_func)

{
  Result RVar1;
  Enum EVar2;
  uint local_1c [2];
  Index index;
  
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->funcs).
                                              super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->funcs).
                                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "function",local_1c);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    EVar2 = Ok;
    if (out_func != (Func **)0x0) {
      *out_func = (this->current_module_->funcs).
                  super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_1c[0]];
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckFuncVar(const Var* var, const Func** out_func) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->funcs.size(), var, "function", &index));
  if (out_func) {
    *out_func = current_module_->funcs[index];
  }
  return Result::Ok;
}